

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O0

void ggml_opt_result_reset(ggml_opt_result_t result)

{
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)0x16664d);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x16665a);
  in_RDI[7] = 0;
  return;
}

Assistant:

void ggml_opt_result_reset(ggml_opt_result_t result) {
    result->ndata = 0;
    result->loss.clear();
    result->pred.clear();
    result->ncorrect = 0;
}